

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  long lVar1;
  int iVar2;
  int iVar3;
  sqlite3_stmt *pStmt_00;
  sqlite3_stmt *pStmt_01;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  u32 x;
  int nStat;
  int rc;
  int i;
  u32 *a;
  char *pBlob;
  sqlite3_stmt *pStmt;
  int nBlob;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  sqlite3_stmt *in_stack_ffffffffffffff90;
  u32 *in_stack_ffffffffffffff98;
  int i_00;
  int in_stack_ffffffffffffffa0;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  sqlite3_stmt *psVar7;
  undefined4 in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0xaaaaaaaa;
  uVar4 = 0xaaaaaaaa;
  iVar2 = *(int *)(in_RSI + 0x30) + 2;
  if (*in_RDI == 0) {
    pStmt_00 = (sqlite3_stmt *)
               sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (pStmt_00 == (sqlite3_stmt *)0x0) {
      *in_RDI = 7;
    }
    else {
      pStmt_01 = pStmt_00 + (long)iVar2 * 4;
      iVar3 = fts3SqlStmt((Fts3Table *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),
                          (int)((ulong)pStmt_01 >> 0x20),(sqlite3_stmt **)pStmt_00,
                          (sqlite3_value **)CONCAT44(uVar5,uVar4));
      if (iVar3 == 0) {
        sqlite3_bind_int(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                         in_stack_ffffffffffffff88);
        iVar3 = sqlite3_step(pStmt_01);
        if (iVar3 == 100) {
          iVar3 = iVar2;
          psVar7 = pStmt_00;
          in_stack_ffffffffffffff98 = (u32 *)sqlite3_column_blob(pStmt_00,iVar2);
          sqlite3_column_bytes(pStmt_00,iVar2);
          fts3DecodeIntArray(iVar3,in_stack_ffffffffffffff98,(char *)pStmt_00,iVar2);
          in_stack_ffffffffffffff8c = iVar2;
          in_stack_ffffffffffffff90 = pStmt_00;
          iVar2 = iVar3;
          pStmt_00 = psVar7;
        }
        else {
          memset(pStmt_00,0,(long)iVar2 << 2);
        }
        iVar3 = sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffa0));
        if (iVar3 == 0) {
          if ((in_R8D < 0) && (*(uint *)pStmt_00 < (uint)-in_R8D)) {
            *(uint *)pStmt_00 = 0;
          }
          else {
            *(uint *)pStmt_00 = in_R8D + *(uint *)pStmt_00;
          }
          for (iVar6 = 0; iVar6 < *(int *)(in_RSI + 0x30) + 1; iVar6 = iVar6 + 1) {
            if ((uint)(*(int *)(pStmt_00 + (long)(iVar6 + 1) * 4) +
                      *(int *)(in_RDX + (long)iVar6 * 4)) < *(uint *)(in_RCX + (long)iVar6 * 4)) {
              in_stack_ffffffffffffffa0 = 0;
            }
            else {
              in_stack_ffffffffffffffa0 =
                   (*(int *)(pStmt_00 + (long)(iVar6 + 1) * 4) + *(int *)(in_RDX + (long)iVar6 * 4))
                   - *(int *)(in_RCX + (long)iVar6 * 4);
            }
            *(int *)(pStmt_00 + (long)(iVar6 + 1) * 4) = in_stack_ffffffffffffffa0;
          }
          fts3EncodeIntArray(iVar2,in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                             (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          i_00 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
          iVar3 = fts3SqlStmt((Fts3Table *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),
                              (int)((ulong)pStmt_01 >> 0x20),(sqlite3_stmt **)pStmt_00,
                              (sqlite3_value **)CONCAT44(iVar6,iVar3));
          if (iVar3 == 0) {
            sqlite3_bind_int(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                             in_stack_ffffffffffffff88);
            sqlite3_bind_blob((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),i_00,
                              in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                              (_func_void_void_ptr *)0x2548bf);
            sqlite3_step(pStmt_01);
            iVar2 = sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar2,in_stack_ffffffffffffffa0));
            *in_RDI = iVar2;
            sqlite3_bind_null(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
            sqlite3_free((void *)0x2548f5);
          }
          else {
            sqlite3_free((void *)0x254884);
            *in_RDI = iVar3;
          }
        }
        else {
          sqlite3_free((void *)0x254756);
          *in_RDI = iVar3;
        }
      }
      else {
        sqlite3_free((void *)0x2546ac);
        *in_RDI = iVar3;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}